

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint readChunk_iTXt(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  size_t __size;
  uchar uVar1;
  int iVar2;
  char *key;
  char *langtag;
  char *transkey;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  uint uVar9;
  size_t sVar10;
  ucvector local_58;
  LodePNGInfo *local_40;
  LodePNGDecompressSettings *local_38;
  
  local_58.data = (uchar *)0x0;
  local_58.size = 0;
  local_58.allocsize = 0;
  if (chunkLength < 5) {
    uVar6 = 0x1e;
  }
  else {
    uVar6 = 1;
    uVar5 = 0;
    do {
      if (data[uVar5] == '\0') break;
      uVar5 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar5 < chunkLength);
    uVar7 = uVar6 - 1;
    uVar9 = uVar6 + 2;
    uVar3 = (ulong)uVar9;
    if (uVar3 < chunkLength) {
      if (0xffffffb0 < uVar6 - 0x51) {
        __size = (ulong)uVar7 + 1;
        local_40 = info;
        local_38 = zlibsettings;
        key = (char *)malloc(__size);
        if (key == (char *)0x0) {
          key = (char *)0x0;
          langtag = (char *)0x0;
          transkey = (char *)0x0;
        }
        else {
          key[uVar5] = '\0';
          memcpy(key,data,(ulong)uVar7);
          transkey = (char *)0x0;
          if (data[uVar5 + 2] != '\0') {
            uVar6 = 0x48;
            langtag = (char *)0x0;
            goto LAB_0010f2c5;
          }
          uVar1 = data[__size];
          do {
            if (data[uVar3] == '\0') break;
            uVar3 = (ulong)(uVar6 + 3 + (int)transkey);
            transkey = (char *)(ulong)((int)transkey + 1);
          } while (uVar3 < chunkLength);
          iVar2 = (int)transkey;
          langtag = (char *)malloc((ulong)(iVar2 + 1U));
          if (langtag == (char *)0x0) {
            langtag = (char *)0x0;
          }
          else {
            langtag[(long)transkey] = '\0';
            if (iVar2 != 0) {
              pcVar4 = (char *)0x0;
              do {
                langtag[(long)pcVar4] = data[(int)pcVar4 + uVar9];
                pcVar4 = pcVar4 + 1;
              } while (transkey != pcVar4);
            }
            uVar9 = iVar2 + 1U + uVar9;
            uVar5 = (ulong)uVar9;
            uVar6 = 0;
            if (uVar5 < chunkLength) {
              uVar6 = 0;
              do {
                if (data[uVar5] == '\0') break;
                uVar5 = (ulong)(iVar2 + uVar7 + 5 + uVar6);
                uVar6 = uVar6 + 1;
              } while (uVar5 < chunkLength);
            }
            transkey = (char *)malloc((ulong)(uVar6 + 1));
            if (transkey != (char *)0x0) {
              transkey[uVar6] = '\0';
              if (uVar6 != 0) {
                uVar5 = 0;
                do {
                  transkey[uVar5] = data[uVar9 + (int)uVar5];
                  uVar5 = uVar5 + 1;
                } while (uVar6 != uVar5);
              }
              uVar9 = uVar6 + 1 + uVar9;
              uVar6 = (uint)chunkLength;
              sVar8 = (size_t)(uVar6 - uVar9);
              if (uVar6 < uVar9) {
                sVar8 = 0;
              }
              if (uVar1 == '\0') {
                uVar5 = (ulong)((int)sVar8 + 1);
                uVar7 = ucvector_reserve(&local_58,uVar5);
                if (uVar7 == 0) goto LAB_0010f475;
                local_58.data[sVar8] = '\0';
                local_58.size = uVar5;
                if (uVar9 < uVar6) {
                  sVar10 = 0;
                  do {
                    local_58.data[sVar10] = data[uVar9 + (int)sVar10];
                    sVar10 = sVar10 + 1;
                  } while (sVar8 != sVar10);
                }
              }
              else {
                uVar6 = zlib_decompress(&local_58.data,&local_58.size,data + uVar9,sVar8,local_38);
                sVar8 = local_58.size;
                if (uVar6 != 0) goto LAB_0010f2c5;
                if (local_58.allocsize < local_58.size) {
                  local_58.allocsize = local_58.size;
                }
                sVar10 = local_58.size + 1;
                uVar6 = ucvector_reserve(&local_58,sVar10);
                if (uVar6 != 0) {
                  local_58.data[sVar8] = '\0';
                  local_58.size = sVar10;
                }
              }
              uVar6 = lodepng_add_itext(local_40,key,langtag,transkey,(char *)local_58.data);
              goto LAB_0010f2c5;
            }
          }
          transkey = (char *)0x0;
        }
LAB_0010f475:
        uVar6 = 0x53;
        goto LAB_0010f2c5;
      }
      uVar6 = 0x59;
    }
    else {
      uVar6 = 0x4b;
    }
  }
  key = (char *)0x0;
  langtag = (char *)0x0;
  transkey = (char *)0x0;
LAB_0010f2c5:
  free(key);
  free(langtag);
  free(transkey);
  local_58.size = 0;
  local_58.allocsize = 0;
  free(local_58.data);
  return uVar6;
}

Assistant:

static void ucvector_init(ucvector* p)
{
  p->data = NULL;
  p->size = p->allocsize = 0;
}